

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O0

int MlmWrap::handle_mlm_msgpipe(zloop_t *loop,zsock_t *reader,void *arg)

{
  int iVar1;
  char *__s1;
  long in_RDX;
  zmsg_t *in_stack_00000010;
  zmsg_t *in_stack_00000018;
  char *in_stack_00000020;
  char *in_stack_00000028;
  MlmWrap *in_stack_00000030;
  char *in_stack_00000038;
  MlmWrap *in_stack_00000040;
  char *cmd;
  zmsg_t *msg;
  MlmWrap *self;
  int local_4;
  
  mlm_client_recv(*(undefined8 *)(in_RDX + 0x30));
  __s1 = (char *)mlm_client_command(*(undefined8 *)(in_RDX + 0x30));
  iVar1 = strcmp(__s1,"STREAM DELIVER");
  if (iVar1 == 0) {
    mlm_client_address(*(undefined8 *)(in_RDX + 0x30));
    mlm_client_sender(*(undefined8 *)(in_RDX + 0x30));
    mlm_client_subject(*(undefined8 *)(in_RDX + 0x30));
    local_4 = route_stream_msgs(in_stack_00000030,in_stack_00000028,in_stack_00000020,
                                (char *)in_stack_00000018,in_stack_00000010);
  }
  else {
    iVar1 = strcmp(__s1,"MAILBOX DELIVER");
    if (iVar1 == 0) {
      mlm_client_address(*(undefined8 *)(in_RDX + 0x30));
      mlm_client_sender(*(undefined8 *)(in_RDX + 0x30));
      mlm_client_subject(*(undefined8 *)(in_RDX + 0x30));
      mlm_client_tracker(*(undefined8 *)(in_RDX + 0x30));
      local_4 = route_mailbox_msgs(in_stack_00000040,in_stack_00000038,(char *)in_stack_00000030,
                                   in_stack_00000028,in_stack_00000020,in_stack_00000018);
    }
    else {
      iVar1 = strcmp(__s1,"SERVICE DELIVER");
      if (iVar1 == 0) {
        mlm_client_address(*(undefined8 *)(in_RDX + 0x30));
        mlm_client_sender(*(undefined8 *)(in_RDX + 0x30));
        mlm_client_subject(*(undefined8 *)(in_RDX + 0x30));
        mlm_client_tracker(*(undefined8 *)(in_RDX + 0x30));
        local_4 = route_service_msgs(in_stack_00000040,in_stack_00000038,(char *)in_stack_00000030,
                                     in_stack_00000028,in_stack_00000020,in_stack_00000018);
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int MlmWrap::handle_mlm_msgpipe(zloop_t *loop, zsock_t *reader, void *arg){
    MlmWrap *self = (MlmWrap*)arg;
    zmsg_t *msg = mlm_client_recv(self->client);
    const char *cmd = mlm_client_command(self->client);
    if(streq(cmd, "STREAM DELIVER")){
        return self->route_stream_msgs(mlm_client_address(self->client),
                mlm_client_sender(self->client),
                mlm_client_subject(self->client),
                msg);
    }
    else if(streq(cmd, "MAILBOX DELIVER")){
        return self->route_mailbox_msgs(mlm_client_address(self->client),
                mlm_client_sender(self->client),
                mlm_client_subject(self->client),
                mlm_client_tracker(self->client),
                msg);
    }
    else if(streq(cmd, "SERVICE DELIVER")){
        return self->route_service_msgs(mlm_client_address(self->client),
                mlm_client_sender(self->client),
                mlm_client_subject(self->client),
                mlm_client_tracker(self->client),
                msg);
    }
    else{
        //Todo: Throw error? who would catch it, not zloop
        return 0;
    }
    return 0;
}